

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int io_std_getset(lua_State *L,ptrdiff_t id,char *mode)

{
  uint32_t uVar1;
  uint uVar2;
  TValue *pTVar3;
  
  pTVar3 = L->top;
  if ((L->base < pTVar3) && (uVar1 = (L->base->field_2).it, uVar1 != 0xffffffff)) {
    if (uVar1 == 0xfffffff3) {
      io_tofile(L);
      L->top = L->base + 1;
    }
    else {
      io_file_open(L,mode);
    }
    uVar2 = L->top[-1].u32.lo;
    pTVar3 = (TValue *)(ulong)uVar2;
    *(uint *)((ulong)(L->glref).ptr32 + 0x198 + id * 4) = uVar2;
  }
  else {
    L->top = pTVar3 + 1;
    (pTVar3->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)(L->glref).ptr32 + 0x198 + id * 4);
    (pTVar3->field_2).it = 0xfffffff3;
  }
  return (int)pTVar3;
}

Assistant:

static int io_std_getset(lua_State *L, ptrdiff_t id, const char *mode)
{
  if (L->base < L->top && !tvisnil(L->base)) {
    if (tvisudata(L->base)) {
      io_tofile(L);
      L->top = L->base+1;
    } else {
      io_file_open(L, mode);
    }
    /* NOBARRIER: The standard I/O handles are GC roots. */
    setgcref(G(L)->gcroot[id], gcV(L->top-1));
  } else {
    setudataV(L, L->top++, IOSTDF_UD(L, id));
  }
  return 1;
}